

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdf.cpp
# Opt level: O2

void CMU462::make_coord_space(Matrix3x3 *o2w,Vector3D *n)

{
  double dVar1;
  Vector3D *pVVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_88;
  Vector3D local_70;
  Vector3D local_58;
  Vector3D local_38;
  
  local_70.x = n->x;
  local_70.y = n->y;
  local_70.z = n->z;
  dVar3 = ABS(local_70.x);
  dVar1 = ABS(local_70.y);
  dVar4 = local_70.y;
  dVar5 = local_70.z;
  if ((dVar1 < dVar3) || (ABS(local_70.z) < dVar3)) {
    local_88 = local_70.x;
    if ((dVar3 < dVar1) || (ABS(local_70.z) < dVar1)) {
      dVar5 = 1.0;
    }
    else {
      dVar4 = 1.0;
    }
  }
  else {
    local_88 = 1.0;
  }
  Vector3D::normalize(&local_70);
  local_38.x = local_70.z * dVar4 - dVar5 * local_70.y;
  local_38.y = local_70.x * dVar5 - local_88 * local_70.z;
  local_38.z = local_88 * local_70.y - local_70.x * dVar4;
  Vector3D::normalize(&local_38);
  local_58.x = local_38.z * local_70.y - local_70.z * local_38.y;
  local_58.y = local_38.x * local_70.z - local_70.x * local_38.z;
  local_58.z = local_70.x * local_38.y - local_38.x * local_70.y;
  Vector3D::normalize(&local_58);
  pVVar2 = Matrix3x3::operator[](o2w,0);
  pVVar2->x = local_58.x;
  pVVar2->y = local_58.y;
  pVVar2->z = local_58.z;
  pVVar2 = Matrix3x3::operator[](o2w,1);
  pVVar2->x = local_38.x;
  pVVar2->y = local_38.y;
  pVVar2->z = local_38.z;
  pVVar2 = Matrix3x3::operator[](o2w,2);
  pVVar2->x = local_70.x;
  pVVar2->y = local_70.y;
  pVVar2->z = local_70.z;
  return;
}

Assistant:

void make_coord_space(Matrix3x3& o2w, const Vector3D& n) {

    Vector3D z = Vector3D(n.x, n.y, n.z);
    Vector3D h = z;
    if (fabs(h.x) <= fabs(h.y) && fabs(h.x) <= fabs(h.z)) h.x = 1.0;
    else if (fabs(h.y) <= fabs(h.x) && fabs(h.y) <= fabs(h.z)) h.y = 1.0;
    else h.z = 1.0;

    z.normalize();
    Vector3D y = cross(h, z);
    y.normalize();
    Vector3D x = cross(z, y);
    x.normalize();

    o2w[0] = x;
    o2w[1] = y;
    o2w[2] = z;
  }